

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

bool loadSphereMeshBuffers(void)

{
  int iVar1;
  int iVar2;
  djgm_vertex *pdVar3;
  uint16_t *puVar4;
  GLboolean GVar5;
  GLenum GVar6;
  djg_mesh *mesh;
  
  mesh = djgm_load_cap(1.5707964,g_sphere.sphere.xTess,g_sphere.sphere.yTess);
  if (mesh != (djg_mesh *)0x0) {
    iVar1 = mesh->vertexc;
    pdVar3 = mesh->vertexv;
    puVar4 = mesh->poly3v;
    iVar2 = mesh->poly3c;
    GVar5 = (*glad_glIsBuffer)(g_gl.buffers[0]);
    if (GVar5 != '\0') {
      (*glad_glDeleteBuffers)(1,g_gl.buffers);
    }
    GVar5 = (*glad_glIsBuffer)(g_gl.buffers[1]);
    if (GVar5 != '\0') {
      (*glad_glDeleteBuffers)(1,g_gl.buffers + 1);
    }
    fwrite("Loading {Mesh-Vertex-Buffer}\n",0x1d,1,_stdout);
    fflush(_stdout);
    (*glad_glGenBuffers)(1,g_gl.buffers);
    (*glad_glBindBuffer)(0x8892,g_gl.buffers[0]);
    (*glad_glBufferData)(0x8892,(long)iVar1 << 6,pdVar3,0x88e4);
    (*glad_glBindBuffer)(0x8892,0);
    fwrite("Loading {Mesh-Grid-Index-Buffer}\n",0x21,1,_stdout);
    fflush(_stdout);
    (*glad_glGenBuffers)(1,g_gl.buffers + 1);
    (*glad_glBindBuffer)(0x8893,g_gl.buffers[1]);
    (*glad_glBufferData)(0x8893,(long)iVar2 * 2,puVar4,0x88e4);
    (*glad_glBindBuffer)(0x8893,0);
    g_sphere.sphere.vertexCnt = iVar1;
    g_sphere.sphere.indexCnt = iVar2;
    djgm_release(mesh);
    GVar6 = (*glad_glGetError)();
    return GVar6 == 0;
  }
  __assert_fail("mesh",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x730,"const djgm_vertex *djgm_get_vertices(const djg_mesh *, GLint *)");
}

Assistant:

bool loadSphereMeshBuffers()
{
    int vertexCnt, indexCnt;
    djg_mesh *mesh = djgm_load_hemisphere(
        g_sphere.sphere.xTess, g_sphere.sphere.yTess
    );
    const djgm_vertex *vertices = djgm_get_vertices(mesh, &vertexCnt);
    const uint16_t *indexes = djgm_get_triangles(mesh, &indexCnt);

    if (glIsBuffer(g_gl.buffers[BUFFER_SPHERE_VERTICES]))
        glDeleteBuffers(1, &g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    if (glIsBuffer(g_gl.buffers[BUFFER_SPHERE_INDEXES]))
        glDeleteBuffers(1, &g_gl.buffers[BUFFER_SPHERE_INDEXES]);

    LOG("Loading {Mesh-Vertex-Buffer}\n");
    glGenBuffers(1, &g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    glBindBuffer(GL_ARRAY_BUFFER, g_gl.buffers[BUFFER_SPHERE_VERTICES]);
    glBufferData(GL_ARRAY_BUFFER,
                 sizeof(djgm_vertex) * vertexCnt,
                 (const void*)vertices,
                 GL_STATIC_DRAW);
    glBindBuffer(GL_ARRAY_BUFFER, 0);

    LOG("Loading {Mesh-Grid-Index-Buffer}\n");
    glGenBuffers(1, &g_gl.buffers[BUFFER_SPHERE_INDEXES]);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_gl.buffers[BUFFER_SPHERE_INDEXES]);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER,
                 sizeof(uint16_t) * indexCnt,
                 (const void *)indexes,
                 GL_STATIC_DRAW);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

    g_sphere.sphere.indexCnt = indexCnt;
    g_sphere.sphere.vertexCnt = vertexCnt;
    djgm_release(mesh);

    return (glGetError() == GL_NO_ERROR);
}